

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

void compute_O_OE_value_V5
               (string *owner_password,string *encryption_key,EncryptionData *data,string *U,
               string *O,string *OE)

{
  string local_148;
  undefined1 local_128 [8];
  string intermediate_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_a1;
  undefined1 local_a0 [8];
  string key_salt;
  allocator local_69;
  undefined1 local_68 [8];
  string validation_salt;
  char k [16];
  string *OE_local;
  string *O_local;
  string *U_local;
  EncryptionData *data_local;
  string *encryption_key_local;
  string *owner_password_local;
  
  k._8_8_ = OE;
  QUtil::initializeWithRandomBytes((uchar *)(validation_salt.field_2._M_local_buf + 8),0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,validation_salt.field_2._M_local_buf + 8,8,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a0,k,8,&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  hash_V5((string *)((long)&intermediate_key.field_2 + 8),owner_password,(string *)local_68,U,data);
  std::operator+(&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&intermediate_key.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::operator+(&local_c8,&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::__cxx11::string::operator=((string *)O,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)(intermediate_key.field_2._M_local_buf + 8));
  hash_V5((string *)local_128,owner_password,(string *)local_a0,U,data);
  process_with_aes(&local_148,(string *)local_128,true,encryption_key,0,1,(uchar *)0x0,0);
  std::__cxx11::string::operator=((string *)k._8_8_,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

static void
compute_O_OE_value_V5(
    std::string const& owner_password,
    std::string const& encryption_key,
    QPDF::EncryptionData const& data,
    std::string const& U,
    std::string& O,
    std::string& OE)
{
    // Algorithm 3.9 from the PDF 1.7 extension level 3
    char k[16];
    QUtil::initializeWithRandomBytes(reinterpret_cast<unsigned char*>(k), sizeof(k));
    std::string validation_salt(k, 8);
    std::string key_salt(k + 8, 8);
    O = hash_V5(owner_password, validation_salt, U, data) + validation_salt + key_salt;
    std::string intermediate_key = hash_V5(owner_password, key_salt, U, data);
    OE = process_with_aes(intermediate_key, true, encryption_key);
}